

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.cpp
# Opt level: O0

ostream * Kernel::operator<<(ostream *out,FuncTerm *self)

{
  bool bVar1;
  ostream *out_00;
  ostream *self_00;
  long in_RSI;
  ostream *in_RDI;
  BottomFirstIterator iter;
  Stack<Kernel::PolyNf> *stack;
  ostream *in_stack_00000038;
  PolyNf *in_stack_ffffffffffffffc8;
  BottomFirstIterator local_28;
  long local_18;
  long local_10;
  ostream *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  operator<<(in_stack_00000038,(FuncId *)out);
  local_18 = local_10 + 0x10;
  local_28 = Lib::Stack<Kernel::PolyNf>::iterFifo((Stack<Kernel::PolyNf> *)0x90fff5);
  bVar1 = Lib::Stack<Kernel::PolyNf>::BottomFirstIterator::hasNext(&local_28);
  if (bVar1) {
    out_00 = std::operator<<(local_8,"(");
    Lib::Stack<Kernel::PolyNf>::BottomFirstIterator::next(&local_28);
    operator<<(out_00,in_stack_ffffffffffffffc8);
    while (bVar1 = Lib::Stack<Kernel::PolyNf>::BottomFirstIterator::hasNext(&local_28), bVar1) {
      self_00 = std::operator<<(local_8,", ");
      Lib::Stack<Kernel::PolyNf>::BottomFirstIterator::next(&local_28);
      operator<<(out_00,(PolyNf *)self_00);
    }
    std::operator<<(local_8,")");
  }
  return local_8;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const Kernel::FuncTerm& self) 
{ 
  out << self._fun;
  auto& stack = self._args;
  auto iter = stack.iterFifo();

  if (iter.hasNext()) {
    out << "(" << iter.next();
    while (iter.hasNext()) {
      out << ", " << iter.next();
    }
    out << ")";
  }

  return out;
}